

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

int __thiscall V2ModDel::init(V2ModDel *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  float *in_RCX;
  float *in_RDX;
  uint in_R8D;
  
  uVar1 = in_R8D - 1;
  if (uVar1 < (in_R8D ^ uVar1)) {
    this->db[0] = in_RDX;
    this->db[1] = in_RCX;
    this->dbufmask = uVar1;
    this->inst = (V2Instance *)ctx;
    reset(this);
    return extraout_EAX;
  }
  __assert_fail("buflen != 0 && (buflen & (buflen - 1)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                ,0x7a7,"void V2ModDel::init(V2Instance *, float *, float *, int)");
}

Assistant:

void init(V2Instance *instance, float *buf1, float *buf2, int buflen)
    {
        assert(buflen != 0 && (buflen & (buflen - 1)) == 0);
        db[0] = buf1;
        db[1] = buf2;
        dbufmask = buflen - 1;
        inst = instance;

        reset();
    }